

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::tighten(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  type_conflict5 tVar1;
  byte bVar2;
  element_type *peVar3;
  long in_RDI;
  cpp_dec_float<200U,_int,_void> *result_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  double in_stack_fffffffffffffcb8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffcc0;
  self_type *in_stack_fffffffffffffcc8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcd0;
  undefined8 local_2e8 [2];
  double *in_stack_fffffffffffffd28;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffd30;
  undefined8 local_2c8 [3];
  Real local_2b0;
  int local_2a4;
  undefined1 local_2a0 [144];
  Real local_210;
  undefined1 local_204 [156];
  Real local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_160;
  undefined8 local_d8;
  Real *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  Real *local_c0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  long local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  int *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  int *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  undefined8 *local_30;
  long local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  long local_10;
  undefined8 *local_8;
  
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffffca8);
  peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x78e088);
  local_168 = Tolerances::scaleAccordingToEpsilon(peVar3,1e-05);
  local_c8 = &local_160;
  local_d0 = &local_168;
  local_d8 = 0;
  local_c0 = local_d0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (type *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x78e10b);
  local_a8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x1c);
  local_a0 = local_204;
  local_b0 = &local_160;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_b1,local_a8,local_b0);
  local_98 = local_204;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
  local_80 = local_204;
  local_88 = local_a8;
  local_90 = local_b0;
  boost::multiprecision::default_ops::
  eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
             (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffca8,
             (cpp_dec_float<200U,_int,_void> *)0x78e1d2);
  tVar1 = boost::multiprecision::operator>=
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffffca8,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x78e1e4);
  if (tVar1) {
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator-=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffffca8);
    peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x78e22c);
    local_210 = Tolerances::scaleAccordingToEpsilon(peVar3,0.0001);
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffca8,(double *)0x78e257);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x78e26a);
    if (tVar1) {
      local_2a4 = 2;
      local_58 = local_2a0;
      local_60 = &local_2a4;
      local_68 = &local_160;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_69,local_68);
      local_50 = local_2a0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
      local_38 = local_2a0;
      local_40 = local_68;
      local_48 = local_60;
      local_78 = (long)*local_60;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffca8,(longlong *)0x78e344);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator-=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    }
  }
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffffca8);
  peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x78e3dc);
  local_2b0 = Tolerances::scaleAccordingToEpsilon(peVar3,1e-05);
  tVar1 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffffca8,(double *)0x78e407);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x78e41a);
  if (tVar1) {
    local_2c8[0] = 0x3feccccccccccccd;
    local_10 = in_RDI + 0xb0;
    local_18 = local_2c8;
    local_8 = local_18;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffffca8);
    peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x78e4a4);
    result_00 = (cpp_dec_float<200U,_int,_void> *)Tolerances::floatingPointFeastol(peVar3);
    bVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffca8,(double *)0x78e4d5);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x78e4e5);
    if ((bVar2 & 1) != 0) {
      local_2e8[0] = 0x3feccccccccccccd;
      local_28 = in_RDI + 0xb0;
      local_30 = local_2e8;
      local_20 = local_30;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (result_00,in_stack_fffffffffffffd28);
    }
  }
  return;
}

Assistant:

void SPxFastRT<R>::tighten()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);

   if(fastDelta >= this->delta + delta_shift)
   {
      fastDelta -= delta_shift;

      if(fastDelta > this->tolerances()->scaleAccordingToEpsilon(1e-4))
         fastDelta -= 2 * delta_shift;
   }

   if(minStab < this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB))
   {
      minStab /= 0.90;

      if(minStab < this->tolerances()->floatingPointFeastol())
         minStab /= 0.90;
   }
}